

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int send_resumption_token(quicly_conn_t *conn,quicly_send_context_t *s)

{
  uint32_t *puVar1;
  uint8_t *puVar2;
  uint64_t *puVar3;
  st_quicly_now_t *psVar4;
  st_quicly_generate_resumption_token_t *psVar5;
  uint8_t *puVar6;
  undefined8 uVar7;
  size_t __n;
  int iVar8;
  uint8_t *puVar9;
  quicly_sent_t *sent;
  uint8_t tokenbuf_small [128];
  quicly_sent_t *local_338;
  ptls_buffer_t local_330;
  uint8_t *local_310;
  uint8_t local_308 [128];
  quicly_address_token_plaintext_t local_288;
  
  local_330.base = local_308;
  local_330.off = 0;
  local_330.capacity = 0x80;
  local_330.is_allocated = 0;
  psVar4 = ((conn->super).ctx)->now;
  local_288.issued_at = (*psVar4->cb)(psVar4);
  local_288.type = QUICLY_ADDRESS_TOKEN_TYPE_RESUMPTION;
  local_288._4_4_ = 0;
  memset(&local_288.local,0,0x248);
  local_288.remote._0_8_ = *(undefined8 *)&(conn->super).remote.address;
  uVar7 = *(undefined8 *)((long)&(conn->super).remote.address + 0xc);
  local_288.remote._20_8_ = *(undefined8 *)((long)&(conn->super).remote.address + 0x14);
  local_288.remote._8_4_ = (undefined4)*(undefined8 *)((long)&(conn->super).remote.address + 8);
  local_288.remote._12_4_ = (undefined4)uVar7;
  local_288.remote._16_4_ = (undefined4)((ulong)uVar7 >> 0x20);
  psVar5 = ((conn->super).ctx)->generate_resumption_token;
  iVar8 = (*psVar5->cb)(psVar5,conn,&local_330,&local_288);
  if (iVar8 == 0) {
    if (599 < local_330.off) {
      __assert_fail("tokenbuf.off < QUICLY_MIN_CLIENT_INITIAL_SIZE / 2 && \"this is a ballpark figure, but tokens ought to be small\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0xecb,"int send_resumption_token(quicly_conn_t *, quicly_send_context_t *)");
    }
    iVar8 = allocate_ack_eliciting_frame
                      (conn,s,(local_330.off - (local_330.off < 0x40)) + 3,&local_338,
                       on_ack_new_token);
    __n = local_330.off;
    puVar2 = local_330.base;
    if (iVar8 == 0) {
      puVar1 = &(conn->egress).new_token.num_inflight;
      *puVar1 = *puVar1 + 1;
      (local_338->data).max_streams.uni = 1;
      (local_338->data).packet.sent_at = (conn->egress).new_token.generation;
      puVar6 = s->dst;
      *puVar6 = '\a';
      puVar9 = puVar6 + 1;
      if (0x3f < local_330.off) {
        if (local_330.off < 0x4000) {
          puVar6[1] = (byte)(local_330.off >> 8) | 0x40;
          puVar9 = puVar6 + 2;
        }
        else {
          send_resumption_token_cold_1();
          puVar9 = local_310;
        }
      }
      *puVar9 = (uint8_t)__n;
      memcpy(puVar9 + 1,puVar2,__n);
      s->dst = puVar9 + __n + 1;
      puVar2 = &(conn->egress).pending_flows;
      *puVar2 = *puVar2 & 0xdf;
      puVar3 = &(conn->super).stats.num_frames_sent.new_token;
      *puVar3 = *puVar3 + 1;
      iVar8 = 0;
    }
  }
  ptls_buffer__release_memory(&local_330);
  return iVar8;
}

Assistant:

static int send_resumption_token(quicly_conn_t *conn, quicly_send_context_t *s)
{
    quicly_address_token_plaintext_t token;
    ptls_buffer_t tokenbuf;
    uint8_t tokenbuf_small[128];
    quicly_sent_t *sent;
    int ret;

    ptls_buffer_init(&tokenbuf, tokenbuf_small, sizeof(tokenbuf_small));

    /* build token */
    token =
        (quicly_address_token_plaintext_t){QUICLY_ADDRESS_TOKEN_TYPE_RESUMPTION, conn->super.ctx->now->cb(conn->super.ctx->now)};
    token.remote = conn->super.remote.address;
    /* TODO fill token.resumption */

    /* encrypt */
    if ((ret = conn->super.ctx->generate_resumption_token->cb(conn->super.ctx->generate_resumption_token, conn, &tokenbuf,
                                                              &token)) != 0)
        goto Exit;
    assert(tokenbuf.off < QUICLY_MIN_CLIENT_INITIAL_SIZE / 2 && "this is a ballpark figure, but tokens ought to be small");

    /* emit frame */
    if ((ret = allocate_ack_eliciting_frame(conn, s, quicly_new_token_frame_capacity(ptls_iovec_init(tokenbuf.base, tokenbuf.off)),
                                            &sent, on_ack_new_token)) != 0)
        goto Exit;
    ++conn->egress.new_token.num_inflight;
    sent->data.new_token.is_inflight = 1;
    sent->data.new_token.generation = conn->egress.new_token.generation;
    s->dst = quicly_encode_new_token_frame(s->dst, ptls_iovec_init(tokenbuf.base, tokenbuf.off));
    conn->egress.pending_flows &= ~QUICLY_PENDING_FLOW_NEW_TOKEN_BIT;

    ++conn->super.stats.num_frames_sent.new_token;
    QUICLY_PROBE(NEW_TOKEN_SEND, conn, conn->stash.now, tokenbuf.base, tokenbuf.off, sent->data.new_token.generation);
    ret = 0;
Exit:
    ptls_buffer_dispose(&tokenbuf);
    return ret;
}